

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.h
# Opt level: O2

void __thiscall hwnet::http::HttpSession::~HttpSession(HttpSession *this)

{
  std::_Function_base::~_Function_base(&(this->onResponse).super__Function_base);
  std::_Function_base::~_Function_base(&(this->onRequest).super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->packet).super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->recvbuff).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->s).super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<hwnet::http::HttpSession>)._M_weak_this.
              super___weak_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

~HttpSession(){		
	}